

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

bool kj::anon_unknown_0::allowed6(NetworkFilter *filter,StringPtr addrStr)

{
  int iVar1;
  sockaddr_in6 addr;
  
  addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
  addr._20_8_ = 0;
  addr.sin6_family = 10;
  addr.sin6_port = 0;
  addr.sin6_flowinfo = 0;
  inet_pton(10,addrStr.content.ptr,&addr.sin6_addr);
  iVar1 = (**(filter->super_NetworkFilter)._vptr_NetworkFilter)(filter,&addr,0x1c);
  return SUB41(iVar1,0);
}

Assistant:

bool allowed6(_::NetworkFilter& filter, StringPtr addrStr) {
  struct sockaddr_in6 addr;
  memset(&addr, 0, sizeof(addr));
  addr.sin6_family = AF_INET6;
  inet_pton(AF_INET6, addrStr.cStr(), &addr.sin6_addr);
  return filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), sizeof(addr));
}